

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O3

CURLcode Curl_getinfo(Curl_easy *data,CURLINFO info,...)

{
  int iVar1;
  connectdata *pcVar2;
  char *pcVar3;
  curl_socket_t cVar4;
  curl_sslbackend cVar5;
  curl_slist *pcVar6;
  void *pvVar7;
  long lVar8;
  double dVar9;
  char *pcVar10;
  ssl_connect_data *psVar11;
  CURLcode CVar12;
  va_list arg;
  double *local_c8;
  
  if (data == (Curl_easy *)0x0) {
    return CURLE_UNKNOWN_OPTION;
  }
  CVar12 = CURLE_UNKNOWN_OPTION;
  switch((info & 0xf00000) - 0x100000 >> 0x14) {
  case CURLINFO_NONE:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    if ((int)info < 0x10001e) {
      if (info == CURLINFO_EFFECTIVE_URL) {
        pcVar3 = (data->change).url;
        pcVar10 = "";
        if (pcVar3 != (char *)0x0) {
          pcVar10 = pcVar3;
        }
      }
      else if (info == CURLINFO_CONTENT_TYPE) {
        pcVar10 = (data->info).contenttype;
      }
      else {
        if (info != CURLINFO_PRIVATE) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar10 = (char *)(data->set).private_data;
      }
    }
    else {
      switch(info) {
      case CURLINFO_FTP_ENTRY_PATH:
        pcVar10 = (data->state).most_recent_ftp_entrypath;
        break;
      case CURLINFO_REDIRECT_URL:
        pcVar10 = (data->info).wouldredirect;
        break;
      case CURLINFO_PRIMARY_IP:
        pcVar10 = (data->info).conn_primary_ip;
        break;
      case 0x100021:
      case 0x100022:
      case 0x100023:
      case 0x100025:
      case 0x100026:
      case 0x100027:
      case 0x100028:
        goto switchD_0012a021_default;
      case CURLINFO_RTSP_SESSION_ID:
        pcVar10 = (data->set).str[0x32];
        break;
      case CURLINFO_LOCAL_IP:
        pcVar10 = (data->info).conn_local_ip;
        break;
      default:
        if (info != CURLINFO_SCHEME) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar10 = (data->info).conn_scheme;
      }
    }
    *local_c8 = (double)pcVar10;
    goto LAB_0012a67b;
  case 1:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_RESPONSE_CODE:
      dVar9 = (double)(long)(data->info).httpcode;
      break;
    default:
      goto switchD_0012a021_default;
    case CURLINFO_HEADER_SIZE:
      dVar9 = (double)(data->info).header_size;
      break;
    case CURLINFO_REQUEST_SIZE:
      dVar9 = (double)(data->info).request_size;
      break;
    case CURLINFO_SSL_VERIFYRESULT:
      dVar9 = (double)(data->set).ssl.certverifyresult;
      break;
    case CURLINFO_FILETIME:
      dVar9 = (double)(data->info).filetime;
      break;
    case CURLINFO_REDIRECT_COUNT:
      dVar9 = (double)(data->set).followlocation;
      break;
    case CURLINFO_HTTP_CONNECTCODE:
      dVar9 = (double)(long)(data->info).httpproxycode;
      break;
    case CURLINFO_HTTPAUTH_AVAIL:
      dVar9 = (double)(data->info).httpauthavail;
      break;
    case CURLINFO_PROXYAUTH_AVAIL:
      dVar9 = (double)(data->info).proxyauthavail;
      break;
    case CURLINFO_OS_ERRNO:
      dVar9 = (double)(long)(data->state).os_errno;
      break;
    case CURLINFO_NUM_CONNECTS:
      dVar9 = (double)(data->info).numconnects;
      break;
    case CURLINFO_LASTSOCKET:
      cVar4 = Curl_getconnectinfo(data,(connectdata **)0x0);
      dVar9 = (double)(long)cVar4;
      break;
    case CURLINFO_CONDITION_UNMET:
      dVar9 = (double)(ulong)(data->info).timecond;
      break;
    case CURLINFO_RTSP_CLIENT_CSEQ:
      dVar9 = (double)(data->state).rtsp_next_client_CSeq;
      break;
    case CURLINFO_RTSP_SERVER_CSEQ:
      dVar9 = (double)(data->state).rtsp_next_server_CSeq;
      break;
    case CURLINFO_RTSP_CSEQ_RECV:
      dVar9 = (double)(data->state).rtsp_CSeq_recv;
      break;
    case CURLINFO_PRIMARY_PORT:
      dVar9 = (double)(data->info).conn_primary_port;
      break;
    case CURLINFO_LOCAL_PORT:
      dVar9 = (double)(data->info).conn_local_port;
      break;
    case CURLINFO_HTTP_VERSION:
      iVar1 = (data->info).httpversion;
      if (iVar1 == 10) {
        dVar9 = 4.94065645841247e-324;
      }
      else if (iVar1 == 0x14) {
        dVar9 = 1.48219693752374e-323;
      }
      else if (iVar1 == 0xb) {
        dVar9 = 9.88131291682493e-324;
      }
      else {
        dVar9 = 0.0;
      }
      break;
    case CURLINFO_PROXY_SSL_VERIFYRESULT:
      dVar9 = (double)(data->set).proxy_ssl.certverifyresult;
      break;
    case CURLINFO_PROTOCOL:
      dVar9 = (double)(ulong)(data->info).conn_protocol;
    }
    *local_c8 = dVar9;
    goto LAB_0012a67b;
  case 2:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    break;
  case 3:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    if ((int)info < 0x400022) {
      if (info == CURLINFO_SSL_ENGINES) {
        pcVar6 = Curl_ssl_engines_list(data);
      }
      else {
        if (info != CURLINFO_COOKIELIST) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar6 = Curl_cookie_list(data);
      }
      *local_c8 = (double)pcVar6;
    }
    else {
      if (info != CURLINFO_CERTINFO) {
        if ((info != CURLINFO_TLS_SESSION) && (info != CURLINFO_TLS_SSL_PTR)) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar2 = data->easy_conn;
        *local_c8 = (double)&data->tsi;
        cVar5 = Curl_ssl_backend();
        (data->tsi).backend = cVar5;
        (data->tsi).internals = (void *)0x0;
        if (cVar5 == CURLSSLBACKEND_NONE || pcVar2 == (connectdata *)0x0) {
          return CURLE_OK;
        }
        if (pcVar2->ssl[0].use == false) {
          if (pcVar2->ssl[1].use != true) {
            return CURLE_OK;
          }
          psVar11 = pcVar2->ssl + 1;
        }
        else {
          psVar11 = pcVar2->ssl;
        }
        pvVar7 = (*Curl_ssl->get_internals)(psVar11,info);
        (data->tsi).internals = pvVar7;
        return CURLE_OK;
      }
      *local_c8 = (double)&(data->info).certs;
    }
    goto LAB_0012a67b;
  case 4:
    if (info != CURLINFO_ACTIVESOCKET) {
      return CURLE_UNKNOWN_OPTION;
    }
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    cVar4 = Curl_getconnectinfo(data,(connectdata **)0x0);
    *(curl_socket_t *)local_c8 = cVar4;
    return CURLE_OK;
  case 5:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_SIZE_UPLOAD_T:
      lVar8 = 0xfc0;
      break;
    case CURLINFO_SIZE_DOWNLOAD_T:
      lVar8 = 0xfb8;
      break;
    case CURLINFO_SPEED_DOWNLOAD_T:
      lVar8 = 0xfe8;
      break;
    case CURLINFO_SPEED_UPLOAD_T:
      lVar8 = 0xff0;
      break;
    case 0x60000b:
    case 0x60000c:
    case 0x60000d:
      goto switchD_0012a021_default;
    case CURLINFO_FILETIME_T:
      lVar8 = 0x1670;
      break;
    case CURLINFO_CONTENT_LENGTH_DOWNLOAD_T:
      lVar8 = 0xfa8;
      dVar9 = -NAN;
      if (((data->progress).flags & 0x40) != 0) break;
      goto LAB_0012a55c;
    case CURLINFO_CONTENT_LENGTH_UPLOAD_T:
      lVar8 = 0xfb0;
      dVar9 = -NAN;
      if (((data->progress).flags & 0x20) == 0) goto LAB_0012a55c;
      break;
    default:
      switch(info) {
      case CURLINFO_TOTAL_TIME_T:
        lVar8 = 0xfe0;
        break;
      case CURLINFO_NAMELOOKUP_TIME_T:
        lVar8 = 0xff8;
        break;
      case CURLINFO_CONNECT_TIME_T:
        lVar8 = 0x1000;
        break;
      case CURLINFO_PRETRANSFER_TIME_T:
        lVar8 = 0x1010;
        break;
      case CURLINFO_STARTTRANSFER_TIME_T:
        lVar8 = 0x1018;
        break;
      case CURLINFO_REDIRECT_TIME_T:
        lVar8 = 0x1020;
        break;
      case CURLINFO_APPCONNECT_TIME_T:
        lVar8 = 0x1008;
        break;
      default:
        goto switchD_0012a021_default;
      }
    }
    dVar9 = *(double *)((long)data->sockets + lVar8 + -0x80);
LAB_0012a55c:
    *local_c8 = dVar9;
    goto LAB_0012a67b;
  default:
    goto switchD_0012a021_default;
  }
  switch(info) {
  case CURLINFO_TOTAL_TIME:
    dVar9 = (double)(data->progress).timespent;
    break;
  case CURLINFO_NAMELOOKUP_TIME:
    dVar9 = (double)(data->progress).t_nslookup;
    break;
  case CURLINFO_CONNECT_TIME:
    dVar9 = (double)(data->progress).t_connect;
    break;
  case CURLINFO_PRETRANSFER_TIME:
    dVar9 = (double)(data->progress).t_pretransfer;
    break;
  case CURLINFO_SIZE_UPLOAD:
    dVar9 = (double)(data->progress).uploaded;
    goto LAB_0012a493;
  case CURLINFO_SIZE_DOWNLOAD:
    dVar9 = (double)(data->progress).downloaded;
    goto LAB_0012a493;
  case CURLINFO_SPEED_DOWNLOAD:
    dVar9 = (double)(data->progress).dlspeed;
    goto LAB_0012a493;
  case CURLINFO_SPEED_UPLOAD:
    dVar9 = (double)(data->progress).ulspeed;
    goto LAB_0012a493;
  default:
    goto switchD_0012a021_default;
  case CURLINFO_CONTENT_LENGTH_DOWNLOAD:
    if (((data->progress).flags & 0x40) == 0) {
LAB_0012a4dc:
      dVar9 = -1.0;
    }
    else {
      dVar9 = (double)(data->progress).size_dl;
    }
    goto LAB_0012a493;
  case CURLINFO_CONTENT_LENGTH_UPLOAD:
    if (((data->progress).flags & 0x20) == 0) goto LAB_0012a4dc;
    dVar9 = (double)(data->progress).size_ul;
    goto LAB_0012a493;
  case CURLINFO_STARTTRANSFER_TIME:
    dVar9 = (double)(data->progress).t_starttransfer;
    break;
  case CURLINFO_REDIRECT_TIME:
    dVar9 = (double)(data->progress).t_redirect;
    break;
  case CURLINFO_APPCONNECT_TIME:
    dVar9 = (double)(data->progress).t_appconnect;
  }
  dVar9 = dVar9 / 1000000.0;
LAB_0012a493:
  *local_c8 = dVar9;
LAB_0012a67b:
  CVar12 = CURLE_OK;
switchD_0012a021_default:
  return CVar12;
}

Assistant:

CURLcode Curl_getinfo(struct Curl_easy *data, CURLINFO info, ...)
{
  va_list arg;
  long *param_longp = NULL;
  double *param_doublep = NULL;
  curl_off_t *param_offt = NULL;
  const char **param_charp = NULL;
  struct curl_slist **param_slistp = NULL;
  curl_socket_t *param_socketp = NULL;
  int type;
  CURLcode result = CURLE_UNKNOWN_OPTION;

  if(!data)
    return result;

  va_start(arg, info);

  type = CURLINFO_TYPEMASK & (int)info;
  switch(type) {
  case CURLINFO_STRING:
    param_charp = va_arg(arg, const char **);
    if(param_charp)
      result = getinfo_char(data, info, param_charp);
    break;
  case CURLINFO_LONG:
    param_longp = va_arg(arg, long *);
    if(param_longp)
      result = getinfo_long(data, info, param_longp);
    break;
  case CURLINFO_DOUBLE:
    param_doublep = va_arg(arg, double *);
    if(param_doublep)
      result = getinfo_double(data, info, param_doublep);
    break;
  case CURLINFO_OFF_T:
    param_offt = va_arg(arg, curl_off_t *);
    if(param_offt)
      result = getinfo_offt(data, info, param_offt);
    break;
  case CURLINFO_SLIST:
    param_slistp = va_arg(arg, struct curl_slist **);
    if(param_slistp)
      result = getinfo_slist(data, info, param_slistp);
    break;
  case CURLINFO_SOCKET:
    param_socketp = va_arg(arg, curl_socket_t *);
    if(param_socketp)
      result = getinfo_socket(data, info, param_socketp);
    break;
  default:
    break;
  }

  va_end(arg);

  return result;
}